

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseExpression.cpp
# Opt level: O3

shared_ptr<Kandinsky::BaseExpression> __thiscall
Kandinsky::BaseExpression::makePtr<Kandinsky::Variable>(BaseExpression *this,Variable *arg)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<Kandinsky::BaseExpression> sVar3;
  
  peVar1 = (arg->m_variableExpressionPtr).
           super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _Var2._M_pi = (arg->m_variableExpressionPtr).
                super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var2._M_pi)->_M_use_count = (_Var2._M_pi)->_M_use_count + 1;
    }
  }
  this->_vptr_BaseExpression = (_func_int **)peVar1;
  this[1]._vptr_BaseExpression = (_func_int **)_Var2._M_pi;
  sVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Kandinsky::BaseExpression>)
         sVar3.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BaseExpression> BaseExpression::makePtr<Variable>(const Variable& arg)
    {
        return arg.getVariableExpressionPtr();
    }